

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O2

void cjson_add_raw_should_fail_on_allocation_failure(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = cJSON_CreateObject();
  cJSON_InitHooks(&failing_hooks);
  pcVar1 = cJSON_AddRawToObject(object,"raw","{}");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x15c);
  }
  global_hooks.allocate = malloc;
  global_hooks.deallocate = free;
  global_hooks.reallocate = realloc;
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_raw_should_fail_on_allocation_failure(void)
{
    cJSON *root = cJSON_CreateObject();

    cJSON_InitHooks(&failing_hooks);

    TEST_ASSERT_NULL(cJSON_AddRawToObject(root, "raw", "{}"));

    cJSON_InitHooks(NULL);

    cJSON_Delete(root);
}